

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O2

void __thiscall Task::clear(Task *this)

{
  pointer pOVar1;
  OperandUsage *usage;
  pointer pOVar2;
  __shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> local_48;
  Task *local_38;
  
  this->time_stamp = 0;
  this->execution_memory = 0;
  pOVar1 = (this->ins).super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_38 = this;
  for (pOVar2 = (this->ins).super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
                super__Vector_impl_data._M_start; pOVar2 != pOVar1; pOVar2 = pOVar2 + 1) {
    pOVar2->version =
         (long)((pOVar2->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               id;
    local_48._M_ptr = (element_type *)0x0;
    local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pOVar2->next_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>,&local_48);
    std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pOVar2->prev_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>,
               &(pOVar2->next_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    local_48._M_ptr = (element_type *)0x0;
    local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pOVar2->last_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>,&local_48);
    std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pOVar2->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>,
               &(pOVar2->last_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pOVar2->next_gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>,
               &(pOVar2->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  }
  pOVar1 = (local_38->outs).super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pOVar2 = (local_38->outs).super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>.
                _M_impl.super__Vector_impl_data._M_start; pOVar2 != pOVar1; pOVar2 = pOVar2 + 1) {
    pOVar2->version =
         (long)((pOVar2->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               id;
    local_48._M_ptr = (element_type *)0x0;
    local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pOVar2->next_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>,&local_48);
    std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pOVar2->prev_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>,
               &(pOVar2->next_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    local_48._M_ptr = (element_type *)0x0;
    local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pOVar2->last_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>,&local_48);
    std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pOVar2->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>,
               &(pOVar2->last_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pOVar2->next_gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>,
               &(pOVar2->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  }
  std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>::clear
            (&local_38->to_dealloc_after);
  return;
}

Assistant:

void clear() {
        time_stamp = 0;
        execution_memory = 0;
        for (auto &usage: ins) {
            usage.version = usage.operand->id;
            usage.prev_use = usage.next_use = nullptr;
            usage.next_gen = usage.gen = usage.last_use = nullptr;
        }
        for (auto &usage: outs) {
            usage.version = usage.operand->id;
            usage.prev_use = usage.next_use = nullptr;
            usage.next_gen = usage.gen = usage.last_use = nullptr;
        }
        to_dealloc_after.clear();
    }